

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

int cs_impl::system_cs_ext::init(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  name_space *func;
  string *name;
  namespace_t *in_stack_fffffffffffffcc8;
  __shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffcd0;
  allocator *paVar2;
  string *in_stack_fffffffffffffcd8;
  name_space *in_stack_fffffffffffffce0;
  name_space *this;
  basic_ostream<char,_std::char_traits<char>_> **in_stack_fffffffffffffce8;
  undefined8 in_stack_fffffffffffffd00;
  undefined1 uVar3;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_stack_fffffffffffffd08;
  allocator local_261;
  string local_260 [47];
  undefined1 local_231 [48];
  allocator local_201;
  string local_200 [47];
  allocator local_1d1;
  string local_1d0 [47];
  allocator local_1a1;
  string local_1a0 [47];
  allocator local_171;
  string local_170 [47];
  allocator local_141;
  string local_140 [40];
  undefined8 *local_118;
  allocator local_101;
  string local_100 [40];
  undefined8 *local_d8;
  allocator local_c1;
  string local_c0 [47];
  allocator local_91;
  string local_90 [47];
  allocator local_61;
  string local_60 [63];
  allocator local_21;
  string local_20 [32];
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffd00 >> 0x38);
  console_cs_ext::init(ctx);
  file_cs_ext::init(ctx);
  path_cs_ext::init(ctx);
  std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_20,"console",&local_21);
  cs::make_namespace(in_stack_fffffffffffffcc8);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"file",&local_61);
  cs::make_namespace(in_stack_fffffffffffffcc8);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"path",&local_91);
  cs::make_namespace(in_stack_fffffffffffffcc8);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"in",&local_c1);
  local_d8 = &std::cin;
  any::make_protect<std::shared_ptr<std::istream>,std::istream*,cs_impl::system_cs_ext::init()::__0>
            ((basic_istream<char,_std::char_traits<char>_> **)in_stack_fffffffffffffce8,
             (anon_class_1_0_00000001 *)in_stack_fffffffffffffce0);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"out",&local_101);
  local_118 = &std::cout;
  any::make_protect<std::shared_ptr<std::ostream>,std::ostream*,cs_impl::system_cs_ext::init()::__1>
            (in_stack_fffffffffffffce8,(anon_class_1_0_00000001 *)in_stack_fffffffffffffce0);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"run",&local_141);
  cs::make_cni<cs::numeric(&)(std::__cxx11::string_const&)>
            ((_func_numeric_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
             in_stack_fffffffffffffd08,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"getenv",&local_171);
  cs::make_cni<std::__cxx11::string(&)(std::__cxx11::string_const&)>
            (in_stack_fffffffffffffd08,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"exit",&local_1a1);
  cs::make_cni<void(&)(cs::numeric_const&)>
            ((_func_void_numeric_ptr *)in_stack_fffffffffffffd08,(bool)uVar3);
  func = cs::name_space::add_var
                   (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
                    (var *)in_stack_fffffffffffffcd0);
  paVar2 = &local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"is_platform_windows",paVar2);
  uVar3 = (undefined1)((ulong)paVar2 >> 0x38);
  cs::make_cni<bool(&)()>((_func_bool *)func,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"is_platform_linux",&local_201);
  cs::make_cni<bool(&)()>((_func_bool *)func,(bool)uVar3);
  cs::name_space::add_var
            (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  this = (name_space *)local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_231 + 1),"is_platform_darwin",(allocator *)this);
  cs::make_cni<bool(&)()>((_func_bool *)func,(bool)uVar3);
  name = (string *)
         cs::name_space::add_var(this,in_stack_fffffffffffffcd8,(var *)in_stack_fffffffffffffcd0);
  paVar2 = &local_261;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_260,"is_platform_unix",paVar2);
  cs::make_cni<bool(&)()>((_func_bool *)func,(bool)uVar3);
  cs::name_space::add_var(this,name,(var *)paVar2);
  any::~any((any *)0x278383);
  std::__cxx11::string::~string(local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  any::~any((any *)0x2783aa);
  std::__cxx11::string::~string((string *)(local_231 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_231);
  any::~any((any *)0x2783d1);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  any::~any((any *)0x2783f8);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  any::~any((any *)0x27841f);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  any::~any((any *)0x278446);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  any::~any((any *)0x27846d);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  any::~any((any *)0x278494);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  any::~any((any *)0x2784bb);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  any::~any((any *)0x2784e2);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  any::~any((any *)0x278509);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  any::~any((any *)0x278530);
  std::__cxx11::string::~string(local_20);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return iVar1;
}

Assistant:

void init()
		{
			console_cs_ext::init();
			file_cs_ext::init();
			path_cs_ext::init();
			(*system_ext)
			.add_var("console", make_namespace(console_ext))
			.add_var("file", make_namespace(file_ext))
			.add_var("path", make_namespace(path_ext))
			.add_var("in", var::make_protect<istream>(&std::cin, [](std::istream *) {}))
			.add_var("out", var::make_protect<ostream>(&std::cout, [](std::ostream *) {}))
			.add_var("run", make_cni(run))
			.add_var("getenv", make_cni(getenv))
			.add_var("exit", make_cni(exit))
			.add_var("is_platform_windows", make_cni(platform::is_platform_win32))
			.add_var("is_platform_linux", make_cni(platform::is_platform_linux))
			.add_var("is_platform_darwin", make_cni(platform::is_platform_darwin))
			.add_var("is_platform_unix", make_cni(platform::is_platform_unix));
		}